

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O3

int32_t u_charDigitValue_63(UChar32 c)

{
  uint uVar1;
  int32_t iVar2;
  ulong uVar3;
  
  if ((uint)c < 0xd800) {
    uVar1 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar1 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar1 = (uint)c >> 5;
    }
  }
  else {
    uVar3 = 0x11f4;
    if (0x10ffff < (uint)c) goto LAB_0032dceb;
    uVar1 = ((uint)c >> 5 & 0x3f) + (uint)propsTrie_index[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar3 = (ulong)((c & 0x1fU) + (uint)propsTrie_index[uVar1] * 4);
LAB_0032dceb:
  iVar2 = -1;
  if (propsTrie_index[uVar3] < 0x2c0) {
    iVar2 = (propsTrie_index[uVar3] >> 6) - 1;
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_charDigitValue(UChar32 c) {
    uint32_t props;
    int32_t value;
    GET_PROPS(c, props);
    value=(int32_t)GET_NUMERIC_TYPE_VALUE(props)-UPROPS_NTV_DECIMAL_START;
    if(value<=9) {
        return value;
    } else {
        return -1;
    }
}